

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O1

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  Address AVar1;
  Type TVar2;
  Enum EVar3;
  mapped_type *this_00;
  mapped_type *pmVar4;
  Enum EVar5;
  bool bVar6;
  string_view s;
  string name;
  Opcode local_90;
  Opcode local_8c;
  Address local_88;
  uint64_t local_80;
  Info local_78;
  string_view local_40;
  
  local_90.enum_ = opc.enum_;
  local_80 = offset;
  Opcode::GetInfo(&local_78,&local_90);
  local_88 = local_78.memory_size;
  local_8c.enum_ = local_90.enum_;
  if (0xfffffffd < (uint)type.enum_) {
    Opcode::GetInfo(&local_78,&local_8c);
    local_40.data_ = local_78.name;
    local_40.size_ = strlen(local_78.name);
    local_78._0_16_ = string_view::substr(&local_40,local_40.size_ - 2,0xffffffffffffffff);
    s.size_ = 2;
    s.data_ = "_u";
    TVar2.enum_ = string_view::compare((string_view *)&local_78,s);
    Opcode::GetInfo(&local_78,&local_8c);
    if (local_78.memory_size == 4) {
      bVar6 = false;
      TVar2.enum_ = -(uint)(TVar2.enum_ != Any) | I32U;
    }
    else {
      if (local_78.memory_size == 2) {
        EVar3 = I16U;
        EVar5 = I16;
      }
      else {
        if (local_78.memory_size != 1) {
          bVar6 = true;
          goto LAB_001582ff;
        }
        EVar3 = I8U;
        EVar5 = I8;
      }
      bVar6 = TVar2.enum_ == Any;
      TVar2.enum_ = EVar5;
      if (bVar6) {
        TVar2.enum_ = EVar3;
      }
      bVar6 = false;
    }
LAB_001582ff:
    if (!bVar6) goto LAB_00158306;
  }
  TVar2.enum_ = type.enum_;
LAB_00158306:
  AddrExpName_abi_cxx11_((string *)&local_78,this,addr_exp);
  if (local_78.decomp != (char *)0x0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,(key_type *)&local_78);
    pmVar4 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_80);
    AVar1 = local_88;
    if ((pmVar4->byte_size != 0) &&
       (((pmVar4->byte_size != local_88 || ((pmVar4->type).enum_ != TVar2.enum_)) ||
        (pmVar4->align != align)))) {
      pmVar4->is_uniform = false;
    }
    bVar6 = Opcode::IsNaturallyAligned(&local_90,align);
    if (!bVar6) {
      pmVar4->is_uniform = false;
    }
    pmVar4->byte_size = AVar1;
    (pmVar4->type).enum_ = TVar2.enum_;
    pmVar4->align = align;
    EVar3 = (this_00->same_type).enum_;
    if ((EVar3 == TVar2.enum_ || EVar3 == Any) &&
       (this_00->same_align == align || this_00->same_align == 0xffffffffffffffff)) {
      (this_00->same_type).enum_ = TVar2.enum_;
      this_00->same_align = align;
      (this_00->last_opc).enum_ = local_90.enum_;
    }
    else {
      (this_00->same_type).enum_ = Void;
      this_00->same_align = 0xffffffffffffffff;
    }
  }
  if (local_78.name != (char *)((long)&local_78 + 0x10U)) {
    operator_delete(local_78.name);
  }
  return;
}

Assistant:

void LoadStore(uint64_t offset, Opcode opc, Type type, Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size &&
        ((access.byte_size != byte_size) ||
         (access.type != type) ||
         (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }